

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareEquivalentNonStandardWhichCannotBeResolvedUnits_Test::TestBody
          (Units_compareEquivalentNonStandardWhichCannotBeResolvedUnits_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_178 [2];
  AssertHelper local_158 [8];
  Message local_150 [15];
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  UnitsPtr u2;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Units_compareEquivalentNonStandardWhichCannotBeResolvedUnits_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"a",&local_41);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"millisecond",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3,-1.0,local_78);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  libcellml::Units::create();
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"b",&local_d9);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"millisecond",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar3,-1.0,local_100);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  bVar1 = libcellml::Units::equivalent((shared_ptr *)local_20,(shared_ptr *)local_b8);
  local_141 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_178,local_140,"libcellml::Units::equivalent(u1, u2)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x676,pcVar4);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    std::__cxx11::string::~string((string *)local_178);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_b8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, compareEquivalentNonStandardWhichCannotBeResolvedUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("a");
    u1->addUnit("millisecond", -1);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("b");
    u2->addUnit("millisecond", -1);

    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
}